

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::const_unary_go<short>(Boxed_Number *this,Opers t_oper,short *t)

{
  int iVar1;
  bad_any_cast *this_00;
  int *t_00;
  Boxed_Value BVar2;
  int local_10;
  int local_c;
  
  if (t_oper == unary_plus) {
    iVar1 = (int)*t;
    t_00 = &local_10;
  }
  else {
    if (t_oper != unary_minus) {
      this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
      detail::exception::bad_any_cast::bad_any_cast(this_00);
      __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                  detail::exception::bad_any_cast::~bad_any_cast);
    }
    iVar1 = -(int)*t;
    t_00 = &local_c;
  }
  *t_00 = iVar1;
  BVar2 = detail::const_var_impl<int>((detail *)this,t_00);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_unary_go(Operators::Opers t_oper, const T &t)
      {
        switch (t_oper)
        {
          case Operators::unary_minus:
            return const_var(-t);
          case Operators::unary_plus:
            return const_var(+t);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }